

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith_uint256.cpp
# Opt level: O0

int __thiscall base_uint<256U>::CompareTo(base_uint<256U> *this,base_uint<256U> *b)

{
  long in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  int i;
  undefined4 local_24;
  undefined4 local_c;
  
  local_24 = 7;
  do {
    if (local_24 < 0) {
      local_c = 0;
LAB_00210c5c:
      if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
        return local_c;
      }
      __stack_chk_fail();
    }
    if (*(uint *)(in_RDI + (long)local_24 * 4) < *(uint *)(in_RSI + (long)local_24 * 4)) {
      local_c = -1;
      goto LAB_00210c5c;
    }
    if (*(uint *)(in_RSI + (long)local_24 * 4) < *(uint *)(in_RDI + (long)local_24 * 4)) {
      local_c = 1;
      goto LAB_00210c5c;
    }
    local_24 = local_24 + -1;
  } while( true );
}

Assistant:

int base_uint<BITS>::CompareTo(const base_uint<BITS>& b) const
{
    for (int i = WIDTH - 1; i >= 0; i--) {
        if (pn[i] < b.pn[i])
            return -1;
        if (pn[i] > b.pn[i])
            return 1;
    }
    return 0;
}